

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mappedio.c
# Opt level: O2

int prvTidyinitFileSource(TidyAllocator *allocator,TidyInputSource *inp,FILE *fp)

{
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  void *pvVar4;
  stat sbuf;
  
  puVar3 = (undefined8 *)(*allocator->vtbl->alloc)(allocator,0x20);
  if (puVar3 == (undefined8 *)0x0) {
    return -1;
  }
  iVar1 = fileno((FILE *)fp);
  iVar2 = fstat(iVar1,(stat *)&sbuf);
  if (sbuf.st_size != 0 && iVar2 != -1) {
    puVar3[3] = sbuf.st_size;
    pvVar4 = mmap((void *)0x0,sbuf.st_size,1,1,iVar1,0);
    puVar3[1] = pvVar4;
    if (pvVar4 != (void *)0xffffffffffffffff) {
      puVar3[2] = 0;
      *puVar3 = allocator;
      fclose((FILE *)fp);
      inp->getByte = mapped_getByte;
      inp->eof = mapped_eof;
      inp->ungetByte = mapped_ungetByte;
      inp->sourceData = puVar3;
      return 0;
    }
  }
  (*allocator->vtbl->free)(allocator,puVar3);
  iVar1 = prvTidyinitStdIOFileSource(allocator,inp,fp);
  return iVar1;
}

Assistant:

int TY_(initFileSource)( TidyAllocator *allocator, TidyInputSource* inp, FILE* fp )
{
    MappedFileSource* fin;
    struct stat sbuf;
    int fd;

    fin = (MappedFileSource*) TidyAlloc( allocator, sizeof(MappedFileSource) );
    if ( !fin )
        return -1;

    fd = fileno(fp);
    if ( fstat(fd, &sbuf) == -1
         || sbuf.st_size == 0
         || (fin->base = mmap(0, fin->size = sbuf.st_size, PROT_READ,
                              MAP_SHARED, fd, 0)) == MAP_FAILED)
    {
        TidyFree( allocator, fin );
        /* Fallback on standard I/O */
        return TY_(initStdIOFileSource)( allocator, inp, fp );
    }

    fin->pos = 0;
    fin->allocator = allocator;
    fclose(fp);

    inp->getByte    = mapped_getByte;
    inp->eof        = mapped_eof;
    inp->ungetByte  = mapped_ungetByte;
    inp->sourceData = fin;

    return 0;
}